

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O0

QVariant * __thiscall QGenericItemModel::data(QGenericItemModel *this,QModelIndex *index,int role)

{
  long lVar1;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  int *in_stack_00000008;
  QGenericItemModelImplBase *in_stack_00000020;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::unique_ptr<QGenericItemModelImplBase,_QGenericItemModel::Deleter>::operator->
            ((unique_ptr<QGenericItemModelImplBase,_QGenericItemModel::Deleter> *)0x84f913);
  QGenericItemModelImplBase::callConst<QVariant,QModelIndex,int>
            (in_stack_00000020,this._4_4_,index,in_stack_00000008);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QGenericItemModel::data(const QModelIndex &index, int role) const
{
    return impl->callConst<QVariant>(QGenericItemModelImplBase::Data, index, role);
}